

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTransform.h
# Opt level: O0

void __thiscall
xmrig::BaseTransform::set<long>(BaseTransform *this,Document *doc,Value *obj,char *key,long value)

{
  bool bVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RSI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *unaff_retaddr;
  StringRefType *in_stack_00000008;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_00000010;
  char *in_stack_ffffffffffffffa8;
  Ch *in_stack_ffffffffffffffb8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffc0;
  long in_stack_ffffffffffffffc8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffd0;
  
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    operator[]<char_const>(unaff_retaddr,(char *)in_RDI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    rapidjson::StringRef<char>(in_stack_ffffffffffffffa8);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GetAllocator(in_RSI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<long>(in_stack_00000010,in_stack_00000008,(long)unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

inline void set(rapidjson::Document &doc, rapidjson::Value &obj, const char *key, T value)
    {
        if (obj.HasMember(key)) {
            obj[key] = value;
        }
        else {
            obj.AddMember(rapidjson::StringRef(key), value, doc.GetAllocator());
        }
    }